

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void setup_connection(FM_OPN *OPN,FM_CH *CH,int ch)

{
  INT32 *pIVar1;
  INT32 **ppIVar2;
  INT32 **ppIVar3;
  INT32 **ppIVar4;
  INT32 **ppIVar5;
  INT32 **memc;
  INT32 **oc1;
  INT32 **om2;
  INT32 **om1;
  INT32 *carrier;
  int ch_local;
  FM_CH *CH_local;
  FM_OPN *OPN_local;
  
  pIVar1 = OPN->out_fm + ch;
  ppIVar2 = &CH->connect1;
  ppIVar3 = &CH->connect3;
  ppIVar4 = &CH->connect2;
  ppIVar5 = &CH->mem_connect;
  switch(CH->ALGO) {
  case '\0':
    *ppIVar2 = &OPN->c1;
    *ppIVar4 = &OPN->mem;
    *ppIVar3 = &OPN->c2;
    *ppIVar5 = &OPN->m2;
    break;
  case '\x01':
    *ppIVar2 = &OPN->mem;
    *ppIVar4 = &OPN->mem;
    *ppIVar3 = &OPN->c2;
    *ppIVar5 = &OPN->m2;
    break;
  case '\x02':
    *ppIVar2 = &OPN->c2;
    *ppIVar4 = &OPN->mem;
    *ppIVar3 = &OPN->c2;
    *ppIVar5 = &OPN->m2;
    break;
  case '\x03':
    *ppIVar2 = &OPN->c1;
    *ppIVar4 = &OPN->mem;
    *ppIVar3 = &OPN->c2;
    *ppIVar5 = &OPN->c2;
    break;
  case '\x04':
    *ppIVar2 = &OPN->c1;
    *ppIVar4 = pIVar1;
    *ppIVar3 = &OPN->c2;
    *ppIVar5 = &OPN->mem;
    break;
  case '\x05':
    *ppIVar2 = (INT32 *)0x0;
    *ppIVar4 = pIVar1;
    *ppIVar3 = pIVar1;
    *ppIVar5 = &OPN->m2;
    break;
  case '\x06':
    *ppIVar2 = &OPN->c1;
    *ppIVar4 = pIVar1;
    *ppIVar3 = pIVar1;
    *ppIVar5 = &OPN->mem;
    break;
  case '\a':
    *ppIVar2 = pIVar1;
    *ppIVar4 = pIVar1;
    *ppIVar3 = pIVar1;
    *ppIVar5 = &OPN->mem;
  }
  CH->connect4 = pIVar1;
  return;
}

Assistant:

INLINE void setup_connection( FM_OPN *OPN, FM_CH *CH, int ch )
{
	INT32 *carrier = &OPN->out_fm[ch];

	INT32 **om1 = &CH->connect1;
	INT32 **om2 = &CH->connect3;
	INT32 **oc1 = &CH->connect2;

	INT32 **memc = &CH->mem_connect;

	switch( CH->ALGO )
	{
	case 0:
		/* M1---C1---MEM---M2---C2---OUT */
		*om1 = &OPN->c1;
		*oc1 = &OPN->mem;
		*om2 = &OPN->c2;
		*memc= &OPN->m2;
		break;
	case 1:
		/* M1------+-MEM---M2---C2---OUT */
		/*      C1-+                     */
		*om1 = &OPN->mem;
		*oc1 = &OPN->mem;
		*om2 = &OPN->c2;
		*memc= &OPN->m2;
		break;
	case 2:
		/* M1-----------------+-C2---OUT */
		/*      C1---MEM---M2-+          */
		*om1 = &OPN->c2;
		*oc1 = &OPN->mem;
		*om2 = &OPN->c2;
		*memc= &OPN->m2;
		break;
	case 3:
		/* M1---C1---MEM------+-C2---OUT */
		/*                 M2-+          */
		*om1 = &OPN->c1;
		*oc1 = &OPN->mem;
		*om2 = &OPN->c2;
		*memc= &OPN->c2;
		break;
	case 4:
		/* M1---C1-+-OUT */
		/* M2---C2-+     */
		/* MEM: not used */
		*om1 = &OPN->c1;
		*oc1 = carrier;
		*om2 = &OPN->c2;
		*memc= &OPN->mem;   /* store it anywhere where it will not be used */
		break;
	case 5:
		/*    +----C1----+     */
		/* M1-+-MEM---M2-+-OUT */
		/*    +----C2----+     */
		*om1 = NULL;    /* special mark */
		*oc1 = carrier;
		*om2 = carrier;
		*memc= &OPN->m2;
		break;
	case 6:
		/* M1---C1-+     */
		/*      M2-+-OUT */
		/*      C2-+     */
		/* MEM: not used */
		*om1 = &OPN->c1;
		*oc1 = carrier;
		*om2 = carrier;
		*memc= &OPN->mem;   /* store it anywhere where it will not be used */
		break;
	case 7:
		/* M1-+     */
		/* C1-+-OUT */
		/* M2-+     */
		/* C2-+     */
		/* MEM: not used*/
		*om1 = carrier;
		*oc1 = carrier;
		*om2 = carrier;
		*memc= &OPN->mem;   /* store it anywhere where it will not be used */
		break;
	}

	CH->connect4 = carrier;
}